

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativesum.cpp
# Opt level: O2

int __thiscall
ncnn::CumulativeSum::forward_inplace(CumulativeSum *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  float *pfVar9;
  int i_1;
  void *pvVar10;
  ulong uVar11;
  void *pvVar12;
  long lVar13;
  float *pfVar14;
  int k;
  ulong uVar15;
  ulong uVar16;
  int i_2;
  int k_1;
  
  uVar6 = bottom_top_blob->dims;
  if (uVar6 == 1) {
    iVar7 = bottom_top_blob->w;
    pvVar12 = bottom_top_blob->data;
    for (lVar8 = 1; lVar8 < iVar7; lVar8 = lVar8 + 1) {
      *(float *)((long)pvVar12 + lVar8 * 4) =
           *(float *)((long)pvVar12 + lVar8 * 4 + -4) + *(float *)((long)pvVar12 + lVar8 * 4);
    }
    uVar5 = 0;
  }
  else {
    iVar7 = (this->axis >> 0x1f & uVar6) + this->axis;
    if ((uVar6 == 2) && (iVar7 == 0)) {
      uVar6 = bottom_top_blob->w;
      iVar7 = bottom_top_blob->h;
      pfVar9 = (float *)bottom_top_blob->data;
      lVar8 = (long)(int)uVar6 * bottom_top_blob->elemsize;
      uVar5 = 0;
      uVar11 = 0;
      if (0 < (int)uVar6) {
        uVar11 = (ulong)uVar6;
      }
      for (lVar13 = 1; pfVar14 = pfVar9, uVar15 = uVar11, lVar13 < iVar7; lVar13 = lVar13 + 1) {
        while (uVar15 != 0) {
          *(float *)((long)pfVar14 + lVar8) = *pfVar14 + *(float *)((long)pfVar14 + lVar8);
          pfVar14 = pfVar14 + 1;
          uVar15 = uVar15 - 1;
        }
        pfVar9 = (float *)((long)pfVar9 + lVar8);
      }
    }
    else if ((uVar6 == 2) && (iVar7 == 1)) {
      iVar7 = bottom_top_blob->w;
      pvVar12 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      uVar5 = 0;
      uVar6 = bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar6 = uVar5;
      }
      for (uVar11 = 0; uVar11 != uVar6; uVar11 = uVar11 + 1) {
        for (lVar8 = 1; lVar8 < iVar7; lVar8 = lVar8 + 1) {
          *(float *)((long)pvVar12 + lVar8 * 4) =
               *(float *)((long)pvVar12 + lVar8 * 4 + -4) + *(float *)((long)pvVar12 + lVar8 * 4);
        }
        pvVar12 = (void *)((long)pvVar12 + sVar2 * (long)iVar7);
      }
    }
    else if ((uVar6 == 3) && (iVar7 == 0)) {
      iVar7 = bottom_top_blob->c;
      uVar6 = bottom_top_blob->h * bottom_top_blob->w;
      pfVar9 = (float *)bottom_top_blob->data;
      lVar8 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      uVar5 = 0;
      if ((int)uVar6 < 1) {
        uVar6 = uVar5;
      }
      for (lVar13 = 1; pfVar14 = pfVar9, uVar11 = (ulong)uVar6, lVar13 < iVar7; lVar13 = lVar13 + 1)
      {
        while (uVar11 != 0) {
          *(float *)((long)pfVar14 + lVar8) = *pfVar14 + *(float *)((long)pfVar14 + lVar8);
          pfVar14 = pfVar14 + 1;
          uVar11 = uVar11 - 1;
        }
        pfVar9 = (float *)((long)pfVar9 + lVar8);
      }
    }
    else if ((uVar6 == 3) && (iVar7 == 1)) {
      uVar6 = bottom_top_blob->w;
      iVar7 = bottom_top_blob->h;
      pvVar12 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      uVar5 = 0;
      uVar11 = 0;
      if (0 < (int)uVar6) {
        uVar11 = (ulong)uVar6;
      }
      uVar4 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar4 = uVar5;
      }
      sVar3 = bottom_top_blob->cstep;
      for (uVar15 = 0; uVar15 != uVar4; uVar15 = uVar15 + 1) {
        pvVar10 = pvVar12;
        for (lVar8 = 1; lVar8 < iVar7; lVar8 = lVar8 + 1) {
          pvVar1 = (void *)((long)pvVar10 + sVar2 * (long)(int)uVar6);
          for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
            *(float *)((long)pvVar1 + uVar16 * 4) =
                 *(float *)((long)pvVar10 + uVar16 * 4) + *(float *)((long)pvVar1 + uVar16 * 4);
          }
          pvVar10 = pvVar1;
        }
        pvVar12 = (void *)((long)pvVar12 + sVar3 * sVar2);
      }
    }
    else {
      uVar5 = 0xffffff9c;
      if ((uVar6 == 3) && (iVar7 == 2)) {
        iVar7 = bottom_top_blob->w;
        sVar2 = bottom_top_blob->elemsize;
        uVar5 = 0;
        uVar6 = bottom_top_blob->h;
        if (bottom_top_blob->h < 1) {
          uVar6 = 0;
        }
        pvVar12 = bottom_top_blob->data;
        uVar4 = bottom_top_blob->c;
        if (bottom_top_blob->c < 1) {
          uVar4 = 0;
        }
        sVar3 = bottom_top_blob->cstep;
        for (uVar11 = 0; uVar11 != uVar4; uVar11 = uVar11 + 1) {
          pvVar10 = pvVar12;
          for (uVar15 = 0; uVar15 != uVar6; uVar15 = uVar15 + 1) {
            for (lVar8 = 1; lVar8 < iVar7; lVar8 = lVar8 + 1) {
              *(float *)((long)pvVar10 + lVar8 * 4) =
                   *(float *)((long)pvVar10 + lVar8 * 4 + -4) +
                   *(float *)((long)pvVar10 + lVar8 * 4);
            }
            pvVar10 = (void *)((long)pvVar10 + sVar2 * (long)iVar7);
          }
          pvVar12 = (void *)((long)pvVar12 + sVar2 * sVar3);
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int CumulativeSum::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1)
    {   // ignore axis
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        for (int i = 1; i < w; ++i)
        {
            ptr[i] = ptr[i] + ptr[i - 1];
        }

        return 0;
    } // if (dims == 1)

    if (dims == 2 && positive_axis == 0)
    {
        // sum over rows
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i = 1; i < h; ++i)
        {
            const float* prev_row = bottom_top_blob.row(i - 1);
            float* this_row = bottom_top_blob.row(i);

            for (int k = 0; k < w; ++k)
            {
                this_row[k] = this_row[k] + prev_row[k];
            }
        }

        return 0;
    } // if (dims == 2 && positive_axis == 0)

    if (dims == 2 && positive_axis == 1)
    {
        // sum over columns
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);

            for (int k = 1; k < w; ++k)
            {
                ptr[k] = ptr[k] + ptr[k - 1];
            }
        }

        return 0;
    } // if (dims == 2 && positive_axis == 1)

    if (dims == 3 && positive_axis == 0)
    {
        // sum over channels
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int c = bottom_top_blob.c;

        int size = w * h;

        for (int i = 1; i < c; ++i)
        {
            const float* prev = bottom_top_blob.channel(i - 1);
            float* cur = bottom_top_blob.channel(i);

            for (int k = 0; k < size; ++k)
            {
                cur[k] = cur[k] + prev[k];
            }
        }

        return 0;
    } // if (dims == 3 && positive_axis == 0)

    if (dims == 3 && positive_axis == 1)
    {
        // sum over rows within each channel

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int c = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat this_channel = bottom_top_blob.channel(q);

            for (int i = 1; i < h; ++i)
            {
                const float* prev_row = this_channel.row(i - 1);
                float* this_row = this_channel.row(i);

                for (int k = 0; k < w; ++k)
                {
                    this_row[k] = this_row[k] + prev_row[k];
                }
            }
        }

        return 0;
    } // if (dims == 3 && positive_axis == 1)

    if (dims == 3 && positive_axis == 2)
    {
        // sum over columns within each channel

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int c = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat this_channel = bottom_top_blob.channel(q);

            for (int i = 0; i < h; ++i)
            {
                float* ptr = this_channel.row(i);
                for (int k = 1; k < w; ++k)
                {
                    ptr[k] = ptr[k] + ptr[k - 1];
                }
            }
        }

        return 0;
    } // if (dims == 3 && positive_axis == 2)

    return -100;
}